

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

string * __thiscall
(anonymous_namespace)::Helper::GetDataRootDestination_abi_cxx11_
          (string *__return_storage_ptr__,void *this,cmInstallCommandArguments *args)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_INSTALL_DATAROOTDIR",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"share",&local_52);
  anon_unknown.dwarf_dd940e::Helper::GetDestination
            (__return_storage_ptr__,(Helper *)this,(cmInstallCommandArguments *)0x0,&local_30,
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string Helper::GetDataRootDestination(
  const cmInstallCommandArguments* args) const
{
  return this->GetDestination(args, "CMAKE_INSTALL_DATAROOTDIR", "share");
}